

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O0

void Abc_NodeLeavesRemove(Vec_Ptr_t *vLeaves,uint uPhase,int nVars)

{
  void *Entry;
  undefined4 local_1c;
  int i;
  int nVars_local;
  uint uPhase_local;
  Vec_Ptr_t *vLeaves_local;
  
  for (local_1c = nVars + -1; -1 < local_1c; local_1c = local_1c + -1) {
    if ((uPhase & 1 << ((byte)local_1c & 0x1f)) != 0) {
      Entry = Vec_PtrEntry(vLeaves,local_1c);
      Vec_PtrRemove(vLeaves,Entry);
    }
  }
  return;
}

Assistant:

void Abc_NodeLeavesRemove( Vec_Ptr_t * vLeaves, unsigned uPhase, int nVars )
{
    int i;
    for ( i = nVars - 1; i >= 0; i-- )
        if ( uPhase & (1 << i) )
            Vec_PtrRemove( vLeaves, Vec_PtrEntry(vLeaves, i) );
}